

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O2

void __thiscall
spoa::SisdAlignmentEngine::Realloc
          (SisdAlignmentEngine *this,uint64_t matrix_width,uint64_t matrix_height,uint8_t num_codes)

{
  AlignmentSubtype AVar1;
  ulong in_RAX;
  Implementation *pIVar2;
  long lVar3;
  undefined8 uStack_28;
  
  pIVar2 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl;
  uStack_28 = in_RAX;
  if ((ulong)((long)*(pointer *)
                     ((long)&(pIVar2->node_id_to_rank).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     + 8) -
              *(long *)&(pIVar2->node_id_to_rank).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl >> 2
             ) < matrix_height - 1) {
    uStack_28 = in_RAX & 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&pIVar2->node_id_to_rank,matrix_height - 1,
               (value_type_conflict2 *)((long)&uStack_28 + 4));
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(pIVar2->sequence_profile).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
              *(long *)&(pIVar2->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data >> 2) < num_codes * matrix_width) {
    uStack_28 = uStack_28 & 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (&pIVar2->sequence_profile,num_codes * matrix_width,
               (value_type_conflict1 *)((long)&uStack_28 + 4));
  }
  AVar1 = (this->super_AlignmentEngine).subtype_;
  if (AVar1 == kConvex) {
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    lVar3 = matrix_height * matrix_width;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) <
        (ulong)(lVar3 * 5)) {
      uStack_28 = uStack_28 & 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->M,lVar3 * 5,(value_type_conflict1 *)((long)&uStack_28 + 4));
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->H = *(int32_t **)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->F = pIVar2->H + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->E = pIVar2->F + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->O = pIVar2->E + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->Q = pIVar2->O + lVar3;
    }
  }
  else if (AVar1 == kAffine) {
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    lVar3 = matrix_height * matrix_width;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) <
        (ulong)(lVar3 * 3)) {
      uStack_28 = uStack_28 & 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->M,lVar3 * 3,(value_type_conflict1 *)((long)&uStack_28 + 4));
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->H = *(int32_t **)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->F = pIVar2->H + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->E = pIVar2->F + lVar3;
    }
  }
  else if (AVar1 == kLinear) {
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) <
        matrix_height * matrix_width) {
      uStack_28 = uStack_28 & 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->M,matrix_height * matrix_width,
                 (value_type_conflict1 *)((long)&uStack_28 + 4));
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      pIVar2->H = *(int32_t **)&(pIVar2->M).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
       .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl)->F =
           (int32_t *)0x0;
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
       .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl)->E =
           (int32_t *)0x0;
    }
  }
  return;
}

Assistant:

void SisdAlignmentEngine::Realloc(
    std::uint64_t matrix_width,
    std::uint64_t matrix_height,
    std::uint8_t num_codes) {
  if (pimpl_->node_id_to_rank.size() < matrix_height - 1) {
    pimpl_->node_id_to_rank.resize(matrix_height - 1, 0);
  }
  if (pimpl_->sequence_profile.size() < num_codes * matrix_width) {
    pimpl_->sequence_profile.resize(num_codes * matrix_width, 0);
  }
  if (subtype_ == AlignmentSubtype::kLinear) {
    if (pimpl_->M.size() < matrix_height * matrix_width) {
      pimpl_->M.resize(matrix_width * matrix_height, 0);
      pimpl_->H = pimpl_->M.data();
      pimpl_->F = nullptr;
      pimpl_->E = nullptr;
    }
  } else if (subtype_ == AlignmentSubtype::kAffine) {
    if (pimpl_->M.size() < 3 * matrix_height * matrix_width) {
      pimpl_->M.resize(3 * matrix_width * matrix_height, 0);
      pimpl_->H = pimpl_->M.data();
      pimpl_->F = pimpl_->H + matrix_width * matrix_height;
      pimpl_->E = pimpl_->F + matrix_width * matrix_height;
    }
  } else if (subtype_ == AlignmentSubtype::kConvex) {
    if (pimpl_->M.size() < 5 * matrix_height * matrix_width) {
      pimpl_->M.resize(5 * matrix_width * matrix_height, 0);
      pimpl_->H = pimpl_->M.data();
      pimpl_->F = pimpl_->H + matrix_width * matrix_height;
      pimpl_->E = pimpl_->F + matrix_width * matrix_height;
      pimpl_->O = pimpl_->E + matrix_width * matrix_height;
      pimpl_->Q = pimpl_->O + matrix_width * matrix_height;
    }
  }
}